

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O3

unsigned_long __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
as_integer<unsigned_long>(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  double dVar1;
  uint uVar2;
  json_runtime_error<std::domain_error,_void> *this_00;
  json_runtime_error<std::runtime_error,_void> *this_01;
  ulong uVar3;
  string_view_type sVar4;
  string_view_type sVar5;
  type tVar6;
  error_code eVar7;
  string local_50;
  unsigned_long local_30;
  to_integer_result<unsigned_long,_char> local_28;
  
  while (uVar2 = *(byte *)&((pointer)this)->
                           super_heap_string_base<unsigned_long,_std::allocator<char>_> & 0xf,
        uVar2 - 8 < 2) {
    this = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
           (((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
              *)&((pointer)this)->super_heap_string_base<unsigned_long,_std::allocator<char>_>)->
           byte_str_).ptr_;
  }
  switch(uVar2) {
  case 1:
    local_30 = (unsigned_long)
               *(byte *)((long)&(((pointer)this)->
                                super_heap_string_base<unsigned_long,_std::allocator<char>_>).extra_
                        + 2);
    break;
  case 2:
  case 3:
    local_30 = *(unsigned_long *)
                &(((pointer)this)->super_heap_string_base<unsigned_long,_std::allocator<char>_>).
                 field_0x8;
    break;
  default:
    this_00 = (json_runtime_error<std::domain_error,_void> *)__cxa_allocate_exception(0x18);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Not an integer","");
    json_runtime_error<std::domain_error,_void>::json_runtime_error(this_00,&local_50);
    __cxa_throw(this_00,&json_runtime_error<std::domain_error,void>::typeinfo,
                json_runtime_error<std::domain_error,_void>::~json_runtime_error);
  case 5:
    dVar1 = *(double *)
             &(((pointer)this)->super_heap_string_base<unsigned_long,_std::allocator<char>_>).
              field_0x8;
    uVar3 = (ulong)dVar1;
    local_30 = (long)(dVar1 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
    break;
  case 6:
    local_30 = (unsigned_long)
               *(ushort *)
                ((long)&(((pointer)this)->
                        super_heap_string_base<unsigned_long,_std::allocator<char>_>).extra_ + 2);
    break;
  case 7:
  case 0xf:
    sVar4 = as_string_view(this);
    sVar5 = as_string_view(this);
    tVar6 = detail::to_integer<unsigned_long,char>(sVar4._M_str,sVar5._M_len,&local_30);
    local_28.ptr = tVar6.ptr;
    local_28.ec = tVar6.ec;
    if (local_28.ec != success) {
      this_01 = (json_runtime_error<std::runtime_error,_void> *)__cxa_allocate_exception(0x18);
      eVar7 = detail::to_integer_result<unsigned_long,_char>::error_code(&local_28);
      (**(code **)(*(long *)eVar7._M_cat + 0x20))(&local_50,eVar7._M_cat,eVar7._M_value);
      json_runtime_error<std::runtime_error,_void>::json_runtime_error(this_01,&local_50);
      __cxa_throw(this_01,&json_runtime_error<std::runtime_error,void>::typeinfo,
                  json_runtime_error<std::runtime_error,_void>::~json_runtime_error);
    }
  }
  return local_30;
}

Assistant:

IntegerType as_integer() const
        {
            switch (storage_kind())
            {
                case json_storage_kind::short_str:
                case json_storage_kind::long_str:
                {
                    IntegerType val;
                    auto result = jsoncons::detail::to_integer(as_string_view().data(), as_string_view().length(), val);
                    if (!result)
                    {
                        JSONCONS_THROW(json_runtime_error<std::runtime_error>(result.error_code().message()));
                    }
                    return val;
                }
                case json_storage_kind::half_float:
                    return static_cast<IntegerType>(cast<half_storage>().value());
                case json_storage_kind::float64:
                    return static_cast<IntegerType>(cast<double_storage>().value());
                case json_storage_kind::int64:
                    return static_cast<IntegerType>(cast<int64_storage>().value());
                case json_storage_kind::uint64:
                    return static_cast<IntegerType>(cast<uint64_storage>().value());
                case json_storage_kind::boolean:
                    return static_cast<IntegerType>(cast<bool_storage>().value() ? 1 : 0);
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().template as_integer<IntegerType>();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().template as_integer<IntegerType>();
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Not an integer"));
            }
        }